

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitUnary(FunctionValidator *this,Unary *curr)

{
  Expression *pEVar1;
  bool bVar2;
  Module *pMVar3;
  FeatureSet local_234;
  Type local_230;
  Type local_228;
  Type local_220;
  Type local_218;
  Type local_210;
  Type local_208;
  Type local_200;
  Type local_1f8;
  Type local_1f0;
  Type local_1e8;
  Type local_1e0;
  Type local_1d8;
  Type local_1d0;
  Type local_1c8;
  Type local_1c0;
  Type local_1b8;
  Type local_1b0;
  Type local_1a8;
  Type local_1a0;
  Type local_198;
  Type local_190;
  Type local_188;
  Type local_180;
  Type local_178;
  Type local_170;
  Type local_168;
  Type local_160;
  Type local_158;
  Type local_150;
  Type local_148;
  Type local_140;
  Type local_138;
  Type local_130;
  Type local_128;
  Type local_120;
  Type local_118;
  Type local_110;
  Type local_108;
  Type local_100;
  Type local_f8;
  Type local_f0;
  Type local_e8;
  Type local_e0;
  Type local_d8;
  Type local_d0;
  Type local_c8;
  Type local_c0;
  Type local_b8;
  Type local_b0;
  Type local_a8;
  Type local_a0;
  Type local_98;
  Type local_90;
  Type local_88;
  Type local_80;
  BasicType local_74;
  Type local_70;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  BasicType local_2c;
  Type local_28;
  Type local_20;
  Unary *local_18;
  Unary *curr_local;
  FunctionValidator *this_local;
  
  local_20.id = (curr->value->type).id;
  local_18 = curr;
  curr_local = (Unary *)this;
  wasm::Type::Type(&local_28,none);
  shouldBeUnequal<wasm::Unary*,wasm::Type>
            (this,local_20,local_28,local_18,"unaries must not receive a none as their input");
  local_2c = unreachable;
  bVar2 = wasm::Type::operator==(&local_18->value->type,&local_2c);
  if (!bVar2) {
    switch(local_18->op) {
    case ClzInt32:
    case CtzInt32:
    case PopcntInt32:
      local_38.id = (local_18->value->type).id;
      wasm::Type::Type(&local_40,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_38,local_40,local_18,"i32 unary value type must be correct");
      break;
    case ClzInt64:
    case CtzInt64:
    case PopcntInt64:
      local_48.id = (local_18->value->type).id;
      wasm::Type::Type(&local_50,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_48,local_50,local_18,"i64 unary value type must be correct");
      break;
    case NegFloat32:
    case AbsFloat32:
    case CeilFloat32:
    case FloorFloat32:
    case TruncFloat32:
    case NearestFloat32:
    case SqrtFloat32:
      local_58.id = (local_18->value->type).id;
      wasm::Type::Type(&local_60,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_58,local_60,local_18,"f32 unary value type must be correct");
      break;
    case NegFloat64:
    case AbsFloat64:
    case CeilFloat64:
    case FloorFloat64:
    case TruncFloat64:
    case NearestFloat64:
    case SqrtFloat64:
      local_68.id = (local_18->value->type).id;
      wasm::Type::Type(&local_70,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_68,local_70,local_18,"f64 unary value type must be correct");
      break;
    case EqZInt32:
      local_74 = i32;
      bVar2 = wasm::Type::operator==(&local_18->value->type,&local_74);
      shouldBeTrue<wasm::Unary*>(this,bVar2,local_18,"i32.eqz input must be i32");
      break;
    case EqZInt64:
      pEVar1 = local_18->value;
      wasm::Type::Type(&local_80,i64);
      bVar2 = wasm::Type::operator==(&pEVar1->type,&local_80);
      shouldBeTrue<wasm::Unary*>(this,bVar2,local_18,"i64.eqz input must be i64");
      break;
    case ExtendSInt32:
    case ExtendUInt32:
    case ExtendS8Int32:
    case ExtendS16Int32:
      local_88.id = (local_18->value->type).id;
      wasm::Type::Type(&local_90,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_88,local_90,local_18,"extend type must be correct");
      break;
    case WrapInt64:
      local_a8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_b0,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_a8,local_b0,local_18,"wrap type must be correct");
      break;
    case TruncSFloat32ToInt32:
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt32:
    case TruncUFloat32ToInt64:
      local_b8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_c0,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_b8,local_c0,local_18,"trunc type must be correct");
      break;
    case TruncSFloat64ToInt32:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt32:
    case TruncUFloat64ToInt64:
      local_d8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_e0,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_d8,local_e0,local_18,"trunc type must be correct");
      break;
    case ReinterpretFloat32:
      local_f8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_100,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_f8,local_100,local_18,"reinterpret/f32 type must be correct");
      break;
    case ReinterpretFloat64:
      local_108.id = (local_18->value->type).id;
      wasm::Type::Type(&local_110,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_108,local_110,local_18,"reinterpret/f64 type must be correct");
      break;
    case ConvertSInt32ToFloat32:
    case ConvertSInt32ToFloat64:
    case ConvertUInt32ToFloat32:
    case ConvertUInt32ToFloat64:
      local_118.id = (local_18->value->type).id;
      wasm::Type::Type(&local_120,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_118,local_120,local_18,"convert type must be correct");
      break;
    case ConvertSInt64ToFloat32:
    case ConvertSInt64ToFloat64:
    case ConvertUInt64ToFloat32:
    case ConvertUInt64ToFloat64:
      local_128.id = (local_18->value->type).id;
      wasm::Type::Type(&local_130,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_128,local_130,local_18,"convert type must be correct");
      break;
    case PromoteFloat32:
      local_138.id = (local_18->value->type).id;
      wasm::Type::Type(&local_140,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_138,local_140,local_18,"promote type must be correct");
      break;
    case DemoteFloat64:
      local_148.id = (local_18->value->type).id;
      wasm::Type::Type(&local_150,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_148,local_150,local_18,"demote type must be correct");
      break;
    case ReinterpretInt32:
      local_158.id = (local_18->value->type).id;
      wasm::Type::Type(&local_160,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_158,local_160,local_18,"reinterpret/i32 type must be correct");
      break;
    case ReinterpretInt64:
      local_168.id = (local_18->value->type).id;
      wasm::Type::Type(&local_170,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_168,local_170,local_18,"reinterpret/i64 type must be correct");
      break;
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64:
      local_98.id = (local_18->value->type).id;
      wasm::Type::Type(&local_a0,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_98,local_a0,local_18,"extend type must be correct");
      break;
    case TruncSatSFloat32ToInt32:
    case TruncSatUFloat32ToInt32:
    case TruncSatSFloat32ToInt64:
    case TruncSatUFloat32ToInt64:
      local_c8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_d0,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_c8,local_d0,local_18,"trunc type must be correct");
      break;
    case TruncSatSFloat64ToInt32:
    case TruncSatUFloat64ToInt32:
    case TruncSatSFloat64ToInt64:
    case TruncSatUFloat64ToInt64:
      local_e8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_f0,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_e8,local_f0,local_18,"trunc type must be correct");
      break;
    case SplatVecI8x16:
    case SplatVecI16x8:
    case SplatVecI32x4:
      local_178.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_180,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_178,local_180,local_18,"expected splat to have v128 type");
      local_188.id = (local_18->value->type).id;
      wasm::Type::Type(&local_190,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_188,local_190,local_18,"expected i32 splat value");
      break;
    case SplatVecI64x2:
      local_198.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_1a0,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_198,local_1a0,local_18,"expected splat to have v128 type");
      local_1a8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_1b0,i64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_1a8,local_1b0,local_18,"expected i64 splat value");
      break;
    case SplatVecF32x4:
      local_1b8.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_1c0,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_1b8,local_1c0,local_18,"expected splat to have v128 type");
      local_1c8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_1d0,f32);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_1c8,local_1d0,local_18,"expected f32 splat value");
      break;
    case SplatVecF64x2:
      local_1d8.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_1e0,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_1d8,local_1e0,local_18,"expected splat to have v128 type");
      local_1e8.id = (local_18->value->type).id;
      wasm::Type::Type(&local_1f0,f64);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_1e8,local_1f0,local_18,"expected f64 splat value");
      break;
    case NotVec128:
    case AbsVecI8x16:
    case NegVecI8x16:
    case PopcntVecI8x16:
    case AbsVecI16x8:
    case NegVecI16x8:
    case AbsVecI32x4:
    case NegVecI32x4:
    case AbsVecI64x2:
    case NegVecI64x2:
    case AbsVecF32x4:
    case NegVecF32x4:
    case SqrtVecF32x4:
    case CeilVecF32x4:
    case FloorVecF32x4:
    case TruncVecF32x4:
    case NearestVecF32x4:
    case AbsVecF64x2:
    case NegVecF64x2:
    case SqrtVecF64x2:
    case CeilVecF64x2:
    case FloorVecF64x2:
    case TruncVecF64x2:
    case NearestVecF64x2:
    case ExtAddPairwiseSVecI8x16ToI16x8:
    case ExtAddPairwiseUVecI8x16ToI16x8:
    case ExtAddPairwiseSVecI16x8ToI32x4:
    case ExtAddPairwiseUVecI16x8ToI32x4:
    case TruncSatSVecF32x4ToVecI32x4:
    case TruncSatUVecF32x4ToVecI32x4:
    case ConvertSVecI32x4ToVecF32x4:
    case ConvertUVecI32x4ToVecF32x4:
    case ExtendLowSVecI8x16ToVecI16x8:
    case ExtendHighSVecI8x16ToVecI16x8:
    case ExtendLowUVecI8x16ToVecI16x8:
    case ExtendHighUVecI8x16ToVecI16x8:
    case ExtendLowSVecI16x8ToVecI32x4:
    case ExtendHighSVecI16x8ToVecI32x4:
    case ExtendLowUVecI16x8ToVecI32x4:
    case ExtendHighUVecI16x8ToVecI32x4:
    case ExtendLowSVecI32x4ToVecI64x2:
    case ExtendHighSVecI32x4ToVecI64x2:
    case ExtendLowUVecI32x4ToVecI64x2:
    case ExtendHighUVecI32x4ToVecI64x2:
    case ConvertLowSVecI32x4ToVecF64x2:
    case ConvertLowUVecI32x4ToVecF64x2:
    case TruncSatZeroSVecF64x2ToVecI32x4:
    case TruncSatZeroUVecF64x2ToVecI32x4:
    case DemoteZeroVecF64x2ToVecF32x4:
    case PromoteLowVecF32x4ToVecF64x2:
    case RelaxedTruncSVecF32x4ToVecI32x4:
    case RelaxedTruncUVecF32x4ToVecI32x4:
    case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      local_1f8.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_200,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>(this,local_1f8,local_200,local_18,"expected v128 type")
      ;
      local_208.id = (local_18->value->type).id;
      wasm::Type::Type(&local_210,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_208,local_210,local_18,"expected v128 operand");
      break;
    case AnyTrueVec128:
    case AllTrueVecI8x16:
    case BitmaskVecI8x16:
    case AllTrueVecI16x8:
    case BitmaskVecI16x8:
    case AllTrueVecI32x4:
    case BitmaskVecI32x4:
    case AllTrueVecI64x2:
    case BitmaskVecI64x2:
      local_218.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression
                     .type.id;
      wasm::Type::Type(&local_220,i32);
      shouldBeEqual<wasm::Unary*,wasm::Type>(this,local_218,local_220,local_18,"expected i32 type");
      local_228.id = (local_18->value->type).id;
      wasm::Type::Type(&local_230,v128);
      shouldBeEqual<wasm::Unary*,wasm::Type>
                (this,local_228,local_230,local_18,"expected v128 operand");
      break;
    case InvalidUnary:
      handle_unreachable("invalid unary op",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-validator.cpp"
                         ,0x80c);
    }
    local_234 = Features::get(local_18->op);
    pMVar3 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                      );
    bVar2 = FeatureSet::operator<=(&local_234,&pMVar3->features);
    shouldBeTrue<wasm::Unary*>(this,bVar2,local_18,"all used features should be allowed");
  }
  return;
}

Assistant:

void FunctionValidator::visitUnary(Unary* curr) {
  shouldBeUnequal(curr->value->type,
                  Type(Type::none),
                  curr,
                  "unaries must not receive a none as their input");
  if (curr->value->type == Type::unreachable) {
    return; // nothing to check
  }
  switch (curr->op) {
    case ClzInt32:
    case CtzInt32:
    case PopcntInt32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "i32 unary value type must be correct");
      break;
    }
    case ClzInt64:
    case CtzInt64:
    case PopcntInt64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "i64 unary value type must be correct");
      break;
    }
    case NegFloat32:
    case AbsFloat32:
    case CeilFloat32:
    case FloorFloat32:
    case TruncFloat32:
    case NearestFloat32:
    case SqrtFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "f32 unary value type must be correct");
      break;
    }
    case NegFloat64:
    case AbsFloat64:
    case CeilFloat64:
    case FloorFloat64:
    case TruncFloat64:
    case NearestFloat64:
    case SqrtFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "f64 unary value type must be correct");
      break;
    }
    case EqZInt32: {
      shouldBeTrue(
        curr->value->type == Type::i32, curr, "i32.eqz input must be i32");
      break;
    }
    case EqZInt64: {
      shouldBeTrue(curr->value->type == Type(Type::i64),
                   curr,
                   "i64.eqz input must be i64");
      break;
    }
    case ExtendSInt32:
    case ExtendUInt32:
    case ExtendS8Int32:
    case ExtendS16Int32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "extend type must be correct");
      break;
    }
    case ExtendS8Int64:
    case ExtendS16Int64:
    case ExtendS32Int64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "extend type must be correct");
      break;
    }
    case WrapInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::i64), curr, "wrap type must be correct");
      break;
    }
    case TruncSFloat32ToInt32:
    case TruncSFloat32ToInt64:
    case TruncUFloat32ToInt32:
    case TruncUFloat32ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "trunc type must be correct");
      break;
    }
    case TruncSatSFloat32ToInt32:
    case TruncSatSFloat32ToInt64:
    case TruncSatUFloat32ToInt32:
    case TruncSatUFloat32ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "trunc type must be correct");
      break;
    }
    case TruncSFloat64ToInt32:
    case TruncSFloat64ToInt64:
    case TruncUFloat64ToInt32:
    case TruncUFloat64ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "trunc type must be correct");
      break;
    }
    case TruncSatSFloat64ToInt32:
    case TruncSatSFloat64ToInt64:
    case TruncSatUFloat64ToInt32:
    case TruncSatUFloat64ToInt64: {
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "trunc type must be correct");
      break;
    }
    case ReinterpretFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "reinterpret/f32 type must be correct");
      break;
    }
    case ReinterpretFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "reinterpret/f64 type must be correct");
      break;
    }
    case ConvertUInt32ToFloat32:
    case ConvertUInt32ToFloat64:
    case ConvertSInt32ToFloat32:
    case ConvertSInt32ToFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "convert type must be correct");
      break;
    }
    case ConvertUInt64ToFloat32:
    case ConvertUInt64ToFloat64:
    case ConvertSInt64ToFloat32:
    case ConvertSInt64ToFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "convert type must be correct");
      break;
    }
    case PromoteFloat32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f32),
                    curr,
                    "promote type must be correct");
      break;
    }
    case DemoteFloat64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::f64),
                    curr,
                    "demote type must be correct");
      break;
    }
    case ReinterpretInt32: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i32),
                    curr,
                    "reinterpret/i32 type must be correct");
      break;
    }
    case ReinterpretInt64: {
      shouldBeEqual(curr->value->type,
                    Type(Type::i64),
                    curr,
                    "reinterpret/i64 type must be correct");
      break;
    }
    case SplatVecI8x16:
    case SplatVecI16x8:
    case SplatVecI32x4:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::i32), curr, "expected i32 splat value");
      break;
    case SplatVecI64x2:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::i64), curr, "expected i64 splat value");
      break;
    case SplatVecF32x4:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::f32), curr, "expected f32 splat value");
      break;
    case SplatVecF64x2:
      shouldBeEqual(
        curr->type, Type(Type::v128), curr, "expected splat to have v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::f64), curr, "expected f64 splat value");
      break;
    case NotVec128:
    case PopcntVecI8x16:
    case AbsVecI8x16:
    case AbsVecI16x8:
    case AbsVecI32x4:
    case AbsVecI64x2:
    case NegVecI8x16:
    case NegVecI16x8:
    case NegVecI32x4:
    case NegVecI64x2:
    case AbsVecF32x4:
    case NegVecF32x4:
    case SqrtVecF32x4:
    case CeilVecF32x4:
    case FloorVecF32x4:
    case TruncVecF32x4:
    case NearestVecF32x4:
    case AbsVecF64x2:
    case NegVecF64x2:
    case SqrtVecF64x2:
    case CeilVecF64x2:
    case FloorVecF64x2:
    case TruncVecF64x2:
    case NearestVecF64x2:
    case ExtAddPairwiseSVecI8x16ToI16x8:
    case ExtAddPairwiseUVecI8x16ToI16x8:
    case ExtAddPairwiseSVecI16x8ToI32x4:
    case ExtAddPairwiseUVecI16x8ToI32x4:
    case TruncSatSVecF32x4ToVecI32x4:
    case TruncSatUVecF32x4ToVecI32x4:
    case ConvertSVecI32x4ToVecF32x4:
    case ConvertUVecI32x4ToVecF32x4:
    case ExtendLowSVecI8x16ToVecI16x8:
    case ExtendHighSVecI8x16ToVecI16x8:
    case ExtendLowUVecI8x16ToVecI16x8:
    case ExtendHighUVecI8x16ToVecI16x8:
    case ExtendLowSVecI16x8ToVecI32x4:
    case ExtendHighSVecI16x8ToVecI32x4:
    case ExtendLowUVecI16x8ToVecI32x4:
    case ExtendHighUVecI16x8ToVecI32x4:
    case ExtendLowSVecI32x4ToVecI64x2:
    case ExtendHighSVecI32x4ToVecI64x2:
    case ExtendLowUVecI32x4ToVecI64x2:
    case ExtendHighUVecI32x4ToVecI64x2:
    case ConvertLowSVecI32x4ToVecF64x2:
    case ConvertLowUVecI32x4ToVecF64x2:
    case TruncSatZeroSVecF64x2ToVecI32x4:
    case TruncSatZeroUVecF64x2ToVecI32x4:
    case DemoteZeroVecF64x2ToVecF32x4:
    case PromoteLowVecF32x4ToVecF64x2:
    case RelaxedTruncSVecF32x4ToVecI32x4:
    case RelaxedTruncUVecF32x4ToVecI32x4:
    case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    case RelaxedTruncZeroUVecF64x2ToVecI32x4:
      shouldBeEqual(curr->type, Type(Type::v128), curr, "expected v128 type");
      shouldBeEqual(
        curr->value->type, Type(Type::v128), curr, "expected v128 operand");
      break;
    case AnyTrueVec128:
    case AllTrueVecI8x16:
    case AllTrueVecI16x8:
    case AllTrueVecI32x4:
    case AllTrueVecI64x2:
    case BitmaskVecI8x16:
    case BitmaskVecI16x8:
    case BitmaskVecI32x4:
    case BitmaskVecI64x2:
      shouldBeEqual(curr->type, Type(Type::i32), curr, "expected i32 type");
      shouldBeEqual(
        curr->value->type, Type(Type::v128), curr, "expected v128 operand");
      break;
    case InvalidUnary:
      WASM_UNREACHABLE("invalid unary op");
  }
  shouldBeTrue(Features::get(curr->op) <= getModule()->features,
               curr,
               "all used features should be allowed");
}